

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O2

string * __thiscall
libcellml::XmlNode::convertToStrippedString_abi_cxx11_(string *__return_storage_ptr__,XmlNode *this)

{
  _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__0> *p_Var1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__0> *__it;
  _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__0> *p_Var6;
  size_type sVar7;
  pointer pcVar8;
  pointer pcVar9;
  _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__0> *this_00;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  convertToString_abi_cxx11_(__return_storage_ptr__,this);
  __it = (_Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__0> *)
         (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar7 = __return_storage_ptr__->_M_string_length;
  p_Var1 = __it + sVar7;
  this_00 = __it;
  for (lVar5 = (long)sVar7 >> 2; p_Var6 = this_00, 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_0>::
            operator()(this_00,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )this);
    if (bVar4) goto LAB_002323ee;
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_0>::
            operator()(this_00 + 1,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )this);
    p_Var6 = this_00 + 1;
    if (bVar4) goto LAB_002323ee;
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_0>::
            operator()(this_00 + 2,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )this);
    p_Var6 = this_00 + 2;
    if (bVar4) goto LAB_002323ee;
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_0>::
            operator()(this_00 + 3,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )this);
    p_Var6 = this_00 + 3;
    if (bVar4) goto LAB_002323ee;
    this_00 = this_00 + 4;
    sVar7 = sVar7 - 4;
  }
  if (sVar7 == 1) {
LAB_00232521:
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_0>::
            operator()(this_00,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )this);
    p_Var6 = p_Var1;
    if (bVar4) {
      p_Var6 = this_00;
    }
  }
  else if (sVar7 == 2) {
LAB_002323c9:
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_0>::
            operator()(p_Var6,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )this);
    if (!bVar4) {
      this_00 = p_Var6 + 1;
      goto LAB_00232521;
    }
  }
  else {
    p_Var6 = p_Var1;
    if ((sVar7 == 3) &&
       (bVar4 = __gnu_cxx::__ops::
                _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_0>::
                operator()(this_00,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )this), p_Var6 = this_00, !bVar4)) {
      p_Var6 = this_00 + 1;
      goto LAB_002323c9;
    }
  }
LAB_002323ee:
  std::__cxx11::string::erase(__return_storage_ptr__,__it,p_Var6);
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar7 = __return_storage_ptr__->_M_string_length;
  pcVar2 = pcVar3 + sVar7;
  for (lVar5 = (long)sVar7 >> 2; pcVar8 = pcVar3 + sVar7, pcVar9 = pcVar8, 0 < lVar5;
      lVar5 = lVar5 + -1) {
    local_50 = pcVar8;
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_1>::
            operator()((_Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__1>
                        *)&local_50,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    if (bVar4) goto LAB_002324b0;
    local_58 = pcVar3 + (sVar7 - 1);
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_1>::
            operator()((_Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__1>
                        *)&local_58,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar3 + (sVar7 - 1);
    if (bVar4) goto LAB_002324b0;
    local_60 = pcVar3 + (sVar7 - 2);
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_1>::
            operator()((_Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__1>
                        *)&local_60,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar3 + (sVar7 - 2);
    if (bVar4) goto LAB_002324b0;
    local_68 = pcVar3 + (sVar7 - 3);
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_1>::
            operator()((_Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__1>
                        *)&local_68,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar3 + (sVar7 - 3);
    if (bVar4) goto LAB_002324b0;
    sVar7 = sVar7 - 4;
  }
  if (sVar7 == 3) {
    local_38 = pcVar8;
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_1>::
            operator()((_Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__1>
                        *)&local_38,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    if (bVar4) goto LAB_002324b0;
    pcVar8 = pcVar3 + 2;
LAB_002324ef:
    local_40 = pcVar8;
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_1>::
            operator()((_Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__1>
                        *)&local_40,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar9 = pcVar8;
    if (bVar4) goto LAB_002324b0;
    pcVar8 = pcVar8 + -1;
  }
  else {
    if (sVar7 == 2) goto LAB_002324ef;
    pcVar9 = pcVar3;
    if (sVar7 != 1) goto LAB_002324b0;
  }
  local_48 = pcVar8;
  bVar4 = __gnu_cxx::__ops::
          _Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::$_1>::
          operator()((_Iter_negate<libcellml::XmlNode::convertToStrippedString[abi:cxx11]()const::__1>
                      *)&local_48,
                     (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__it);
  pcVar9 = pcVar3;
  if (bVar4) {
    pcVar9 = pcVar8;
  }
LAB_002324b0:
  std::__cxx11::string::erase(__return_storage_ptr__,pcVar9,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlNode::convertToStrippedString() const
{
    std::string contentString = convertToString();
    contentString.erase(contentString.begin(), find_if_not(contentString.begin(), contentString.end(), [](int c) { return isspace(c); }));
    contentString.erase(find_if_not(contentString.rbegin(), contentString.rend(), [](int c) { return isspace(c); }).base(), contentString.end());
    return contentString;
}